

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O0

void living_blade_pulse(OBJ_DATA *obj,OBJ_AFFECT_DATA *af)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  int *piVar6;
  long in_RSI;
  long in_RDI;
  OBJ_AFFECT_DATA *af2;
  CHAR_DATA *ch;
  char buf [4608];
  undefined4 in_stack_ffffffffffffed58;
  int in_stack_ffffffffffffed5c;
  int in_stack_ffffffffffffed60;
  undefined4 in_stack_ffffffffffffed64;
  CHAR_DATA *in_stack_ffffffffffffed68;
  char *in_stack_ffffffffffffed70;
  CHAR_DATA *in_stack_ffffffffffffed78;
  CHAR_DATA *ch_00;
  undefined8 in_stack_ffffffffffffed90;
  undefined1 show;
  CHAR_DATA *in_stack_ffffffffffffed98;
  OBJ_DATA *in_stack_ffffffffffffeda0;
  int local_1240;
  int local_123c [3];
  int local_1230 [2];
  OBJ_AFFECT_DATA *local_1228;
  long local_1220;
  CHAR_DATA local_1218 [5];
  long local_10;
  long local_8;
  
  show = (undefined1)((ulong)in_stack_ffffffffffffed90 >> 0x38);
  local_1220 = *(long *)(in_RDI + 0x28);
  if (local_1220 != 0) {
    local_10 = in_RSI;
    if (local_1220 == *(long *)(in_RSI + 8)) {
      local_8 = in_RDI;
      if ((((*(long *)(local_1220 + 0x20) == 0) && (*(short *)(in_RSI + 0x1c) == 0)) &&
          (iVar3 = number_percent(), iVar3 < 4)) && (*(short *)(local_10 + 0x1a) == 0x13)) {
        iVar3 = number_range(in_stack_ffffffffffffed60,in_stack_ffffffffffffed5c);
        switch(iVar3) {
        case 1:
          in_stack_ffffffffffffed98 = local_1218;
          in_stack_ffffffffffffeda0 =
               (OBJ_DATA *)get_char_color(in_stack_ffffffffffffed78,in_stack_ffffffffffffed70);
          uVar1 = *(undefined8 *)(local_1220 + 0xe8);
          pcVar5 = END_COLOR(in_stack_ffffffffffffed68);
          sprintf((char *)in_stack_ffffffffffffed98,
                  "%sBlood... give me blood, %s, lest I feast upon thine....%s\n\r",
                  in_stack_ffffffffffffeda0,uVar1,pcVar5);
          break;
        case 2:
          pcVar5 = get_char_color(in_stack_ffffffffffffed78,in_stack_ffffffffffffed70);
          pcVar4 = END_COLOR(in_stack_ffffffffffffed68);
          sprintf((char *)local_1218,
                  "%sBaal will be most displeased to learn of your timidity....%s\n\r",pcVar5,pcVar4
                 );
          show = (undefined1)((ulong)pcVar5 >> 0x38);
          break;
        case 3:
          ch_00 = local_1218;
          pcVar5 = get_char_color(ch_00,in_stack_ffffffffffffed70);
          pcVar4 = END_COLOR(in_stack_ffffffffffffed68);
          sprintf((char *)ch_00,
                  "%sI was meant to be wielded by hands more powerful than thine, mortal.%s\n\r",
                  pcVar5,pcVar4);
          break;
        case 4:
          in_stack_ffffffffffffed68 = local_1218;
          in_stack_ffffffffffffed70 =
               get_char_color(in_stack_ffffffffffffed78,in_stack_ffffffffffffed70);
          pcVar5 = END_COLOR(in_stack_ffffffffffffed68);
          sprintf((char *)in_stack_ffffffffffffed68,
                  "%sFool!  Wield me in battle and I will make thee as a god!%s\n\r",
                  in_stack_ffffffffffffed70,pcVar5);
        }
        act(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
            (void *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
            (void *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58),0);
        send_to_char(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
      }
      if ((*(long *)(local_1220 + 0x20) == 0) && (iVar3 = number_percent(), iVar3 < 0x22)) {
        local_1228 = new_affect_obj();
        local_1228->where = *(short *)(local_10 + 0x12);
        local_1228->aftype = *(int *)(local_10 + 0x30);
        local_1228->type = *(short *)(local_10 + 0x14);
        local_1228->owner = *(CHAR_DATA **)(local_10 + 8);
        local_1228->level = *(short *)(local_10 + 0x16);
        local_1228->location = *(short *)(local_10 + 0x1a);
        local_1228->modifier = *(short *)(local_10 + 0x1c);
        local_1228->duration = *(short *)(local_10 + 0x18);
        local_1228->end_fun = *(OAFF_FUN **)(local_10 + 0x48);
        local_1228->pulse_fun = *(OAFF_FUN **)(local_10 + 0x38);
        affect_remove_obj(in_stack_ffffffffffffeda0,(OBJ_AFFECT_DATA *)in_stack_ffffffffffffed98,
                          (bool)show);
        local_1228->modifier = local_1228->modifier + -1;
        local_1230[1] = 0;
        local_1230[0] = (int)local_1228->modifier;
        piVar6 = std::max<int>(local_1230 + 1,local_1230);
        local_1228->modifier = (short)*piVar6;
        affect_to_obj((OBJ_DATA *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                      (OBJ_AFFECT_DATA *)
                      CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
      }
      else if (((*(long *)(local_1220 + 0x20) != 0) &&
               ((*(short *)(local_8 + 0x100) == 0x10 || (*(short *)(local_8 + 0x100) == 0x12)))) &&
              ((bVar2 = is_npc((CHAR_DATA *)
                               CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58)),
               !bVar2 || (iVar3 = number_percent(), iVar3 < 6)))) {
        local_1228 = new_affect_obj();
        local_1228->where = *(short *)(local_10 + 0x12);
        local_1228->aftype = *(int *)(local_10 + 0x30);
        local_1228->type = *(short *)(local_10 + 0x14);
        local_1228->owner = *(CHAR_DATA **)(local_10 + 8);
        local_1228->level = *(short *)(local_10 + 0x16);
        local_1228->location = *(short *)(local_10 + 0x1a);
        local_1228->modifier = *(short *)(local_10 + 0x1c);
        local_1228->duration = *(short *)(local_10 + 0x18);
        local_1228->end_fun = *(OAFF_FUN **)(local_10 + 0x48);
        local_1228->pulse_fun = *(OAFF_FUN **)(local_10 + 0x38);
        affect_remove_obj(in_stack_ffffffffffffeda0,(OBJ_AFFECT_DATA *)in_stack_ffffffffffffed98,
                          (bool)show);
        bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
        if ((bVar2) && (local_1228->modifier < 0x10)) {
          local_1228->modifier = local_1228->modifier + 1;
          local_123c[2] = (int)local_1228->modifier;
          local_123c[1] = 0xf;
          piVar6 = std::min<int>(local_123c + 2,local_123c + 1);
          local_1228->modifier = (short)*piVar6;
        }
        else {
          bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58))
          ;
          if (bVar2) {
            local_1228->modifier = local_1228->modifier + -2;
          }
          else {
            local_1228->modifier = local_1228->modifier + 1;
            local_123c[0] = (int)local_1228->modifier;
            local_1240 = 0x32;
            piVar6 = std::min<int>(local_123c,&local_1240);
            local_1228->modifier = (short)*piVar6;
          }
        }
        affect_to_obj((OBJ_DATA *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                      (OBJ_AFFECT_DATA *)
                      CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
        iVar3 = number_percent();
        if ((iVar3 < 10) && (local_1228->location == 0x13)) {
          iVar3 = number_range(in_stack_ffffffffffffed60,in_stack_ffffffffffffed5c);
          if (iVar3 == 1) {
            act(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
                (void *)CONCAT44(1,in_stack_ffffffffffffed60),
                (void *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58),0);
          }
          else if (iVar3 == 2) {
            act(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
                (void *)CONCAT44(2,in_stack_ffffffffffffed60),
                (void *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58),0);
          }
          else if (iVar3 == 3) {
            act(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
                (void *)CONCAT44(3,in_stack_ffffffffffffed60),
                (void *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58),0);
          }
        }
      }
    }
    else {
      iVar3 = number_percent();
      if ((iVar3 < 7) && (*(short *)(local_10 + 0x1a) == 0x13)) {
        iVar3 = number_range(in_stack_ffffffffffffed60,in_stack_ffffffffffffed5c);
        if (iVar3 == 1) {
          act(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
              (void *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
              (void *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58),0);
        }
        else if (iVar3 == 2) {
          act(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
              (void *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
              (void *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58),0);
        }
        else if (iVar3 == 3) {
          act(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
              (void *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
              (void *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58),0);
        }
      }
    }
  }
  return;
}

Assistant:

void living_blade_pulse(OBJ_DATA *obj, OBJ_AFFECT_DATA *af)
{
	char buf[MSL];
	CHAR_DATA *ch;
	OBJ_AFFECT_DATA *af2;

	if ((ch = obj->carried_by) == nullptr)
		return;

	if (ch != af->owner)
	{
		if (number_percent() < 7 && af->location == APPLY_DAMROLL)
		{
			switch (number_range(1, 3))
			{
				case 1:
					act("$p hisses at you: 'Insignificant whelp, you are unworthy of my power!'", ch, obj, 0, TO_CHAR);
					break;
				case 2:
					act("$p writhes in your grasp as you hear a faint cry of outrage.", ch, obj, 0, TO_CHAR);
					break;
				case 3:
					act("$p whispers menacingly: 'My master will devour your soul, blasphemer.'", ch, obj, 0, TO_CHAR);
					break;
			}
		}

		return;
	}

	if (!ch->fighting && af->modifier == 0)
	{
		if (number_percent() < 4 && af->location == APPLY_DAMROLL)
		{
			switch (number_range(1, 4))
			{
				case 1:
					sprintf(buf, "%sBlood... give me blood, %s, lest I feast upon thine....%s\n\r",
						get_char_color(ch, "red"),
						ch->name,
						END_COLOR(ch));
					break;
				case 2:
					sprintf(buf, "%sBaal will be most displeased to learn of your timidity....%s\n\r",
						get_char_color(ch, "red"),
						END_COLOR(ch));
					break;
				case 3:
					sprintf(buf, "%sI was meant to be wielded by hands more powerful than thine, mortal.%s\n\r",
						get_char_color(ch, "red"),
						END_COLOR(ch));
					break;
				case 4:
					sprintf(buf, "%sFool!  Wield me in battle and I will make thee as a god!%s\n\r",
						get_char_color(ch, "red"),
						END_COLOR(ch));
					break;
			}

			act("$p twists in your grasp, hissing caustically:", ch, obj, 0, TO_CHAR);
			send_to_char(buf, ch);
		}
	}

	if (!ch->fighting && number_percent() <= 33)
	{
		af2 = new_affect_obj();
		af2->where = af->where;
		af2->aftype = af->aftype;
		af2->type = af->type;
		af2->owner = af->owner;
		af2->level = af->level;
		af2->location = af->location;
		af2->modifier = af->modifier;
		af2->duration = af->duration;
		af2->end_fun = af->end_fun;
		af2->pulse_fun = af->pulse_fun;
		affect_remove_obj(obj, af, false);

		af2->modifier--;
		af2->modifier = std::max(0, (int)af2->modifier);
		affect_to_obj(obj, af2);

		return;
	}
	else if (!ch->fighting)
	{
		return;
	}

	if (!(obj->wear_loc == WEAR_WIELD || obj->wear_loc == WEAR_DUAL_WIELD))
		return;

	if (is_npc(ch->fighting) && number_percent() > 5)
		return;

	af2 = new_affect_obj();
	af2->where = af->where;
	af2->aftype = af->aftype;
	af2->type = af->type;
	af2->owner = af->owner;
	af2->level = af->level;
	af2->location = af->location;
	af2->modifier = af->modifier;
	af2->duration = af->duration;
	af2->end_fun = af->end_fun;
	af2->pulse_fun = af->pulse_fun;
	affect_remove_obj(obj, af, false);

	if (is_npc(ch->fighting) && af2->modifier <= 15)
	{
		af2->modifier++;
		af2->modifier = std::min((int)af2->modifier, 15);
	}
	else if (is_npc(ch->fighting))
	{
		af2->modifier -= 2;
	}
	else
	{
		af2->modifier++;
		af2->modifier = std::min((int)af2->modifier, 50);
	}

	affect_to_obj(obj, af2);

	if (number_percent() < 10 && af2->location == APPLY_DAMROLL)
	{
		switch (number_range(1, 3))
		{
			case 1:
				act("A hollow laughter reaches your ears as $p pulses in your grasp.", ch, obj, 0, TO_CHAR);
				break;
			case 2:
				act("$p writhes as you faintly hear sounds not unlike cries of carnal ecstasy.", ch, obj, 0, TO_CHAR);
				break;
			case 3:
				act("$p cries with glee: 'Yes!  Yes!  Tear their heart out!'", ch, obj, 0, TO_CHAR);
				break;
		}
	}
}